

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmenu.cpp
# Opt level: O2

void __thiscall QMenuPrivate::syncPlatformMenu(QMenuPrivate *this)

{
  QWidget *this_00;
  QObject *pQVar1;
  QAction **ppQVar2;
  bool bVar3;
  QPlatformMenuItem *beforeItem;
  long lVar4;
  long in_FS_OFFSET;
  QArrayDataPointer<QAction_*> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  bVar3 = QWeakPointer<QObject>::isNull(&(this->platformMenu).wp);
  if (!bVar3) {
    local_48.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_48.ptr = (QAction **)&DAT_aaaaaaaaaaaaaaaa;
    QWidget::actions((QList<QAction_*> *)&local_48,this_00);
    ppQVar2 = local_48.ptr;
    beforeItem = (QPlatformMenuItem *)0x0;
    for (lVar4 = local_48.size << 3; lVar4 != 0; lVar4 = lVar4 + -8) {
      beforeItem = insertActionInPlatformMenu
                             (this,*(QAction **)((long)ppQVar2 + lVar4 + -8),beforeItem);
    }
    pQVar1 = (this->platformMenu).wp.value;
    (**(code **)(*(long *)pQVar1 + 0x78))(pQVar1,(*(ushort *)&this->field_0x420 & 8) >> 3);
    pQVar1 = (this->platformMenu).wp.value;
    (**(code **)(*(long *)pQVar1 + 0xa0))(pQVar1,(this_00->data->widget_attributes & 1) == 0);
    QArrayDataPointer<QAction_*>::~QArrayDataPointer(&local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMenuPrivate::syncPlatformMenu()
{
    Q_Q(QMenu);
    if (platformMenu.isNull())
        return;

    QPlatformMenuItem *beforeItem = nullptr;
    const QList<QAction*> actions = q->actions();
    for (QList<QAction*>::const_reverse_iterator it = actions.rbegin(), end = actions.rend(); it != end; ++it) {
        QPlatformMenuItem *menuItem = insertActionInPlatformMenu(*it, beforeItem);
        beforeItem = menuItem;
    }
    platformMenu->syncSeparatorsCollapsible(collapsibleSeparators);
    platformMenu->setEnabled(q->isEnabled());
}